

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
CompileRun(JsValueRef scriptVal,JsSourceContext sourceContext,JsValueRef sourceUrl,
          JsParseScriptAttributes parseAttributes,JsValueRef *result,bool parseOnly)

{
  anon_class_48_6_2009d855 fn;
  uint uVar1;
  WCHAR *pWStack_60;
  JsErrorCode error;
  WCHAR *url;
  size_t cb;
  byte *script;
  LoadScriptFlag scriptFlag;
  bool isUtf8;
  bool isString;
  bool isExternalArray;
  bool parseOnly_local;
  JsValueRef *result_local;
  JsValueRef pvStack_30;
  JsParseScriptAttributes parseAttributes_local;
  JsValueRef sourceUrl_local;
  JsSourceContext sourceContext_local;
  JsValueRef scriptVal_local;
  
  if (scriptVal == (JsValueRef)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else if (scriptVal == (JsValueRef)0x0) {
    scriptVal_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (sourceUrl == (JsValueRef)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else {
    script._7_1_ = parseOnly;
    _scriptFlag = result;
    result_local._4_4_ = parseAttributes;
    pvStack_30 = sourceUrl;
    sourceUrl_local = (JsValueRef)sourceContext;
    sourceContext_local = (JsSourceContext)scriptVal;
    script._6_1_ = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    script._5_1_ = 0;
    script._4_1_ = ((result_local._4_4_ & JsParseScriptAttributeArrayBufferIsUtf16Encoded) !=
                    JsParseScriptAttributeNone ^ 0xffU) & 1;
    script._0_4_ = LoadScriptFlag_None;
    if ((bool)script._6_1_) {
      cb = (**(code **)(*(long *)sourceContext_local + 0x390))();
      uVar1 = (**(code **)(*(long *)sourceContext_local + 0x388))();
      url = (WCHAR *)(ulong)uVar1;
      script._0_4_ = LoadScriptFlag_ExternalArrayBuffer;
      if ((script._4_1_ & 1) != 0) {
        script._0_4_ = LoadScriptFlag_ExternalArrayBuffer|LoadScriptFlag_Utf8Source;
      }
    }
    else {
      script._5_1_ = Js::VarIs<Js::JavascriptString>((Var)sourceContext_local);
      if (!(bool)script._5_1_) {
        return JsErrorInvalidArgument;
      }
    }
    fn.scriptVal._0_4_ = (int)&cb;
    fn.isString = (bool *)&sourceContext_local;
    fn.scriptVal._4_4_ = (int)((ulong)&cb >> 0x20);
    fn.script = (byte **)&url;
    fn.cb = (size_t *)&stack0xffffffffffffffd0;
    fn.sourceUrl = &stack0xffffffffffffffa0;
    fn.url = (WCHAR **)((long)&script + 5);
    scriptVal_local._4_4_ =
         GlobalAPIWrapper_NoRecord<CompileRun(void*,unsigned_long,void*,_JsParseScriptAttributes,void**,bool)::__0>
                   (fn);
    if (scriptVal_local._4_4_ == JsNoError) {
      scriptVal_local._4_4_ =
           RunScriptCore((JsValueRef)sourceContext_local,(byte *)cb,(size_t)url,
                         (LoadScriptFlag)script,(JsSourceContext)sourceUrl_local,pWStack_60,
                         (bool)(script._7_1_ & 1),result_local._4_4_,false,_scriptFlag);
    }
  }
  return scriptVal_local._4_4_;
}

Assistant:

_ALWAYSINLINE JsErrorCode CompileRun(
    JsValueRef scriptVal,
    JsSourceContext sourceContext,
    JsValueRef sourceUrl,
    JsParseScriptAttributes parseAttributes,
    _Out_ JsValueRef *result,
    bool parseOnly)
{
    PARAM_NOT_NULL(scriptVal);
    VALIDATE_JSREF(scriptVal);
    PARAM_NOT_NULL(sourceUrl);

    bool isExternalArray = Js::VarIs<Js::ArrayBuffer>(scriptVal),
        isString = false;
    bool isUtf8 = !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

    LoadScriptFlag scriptFlag = LoadScriptFlag_None;
    const byte* script;
    size_t cb;
    const WCHAR *url;

    if (isExternalArray)
    {
        script = ((Js::ExternalArrayBuffer*)(scriptVal))->GetBuffer();

        cb = ((Js::ExternalArrayBuffer*)(scriptVal))->GetByteLength();

        scriptFlag = (LoadScriptFlag)(isUtf8 ?
            LoadScriptFlag_ExternalArrayBuffer | LoadScriptFlag_Utf8Source :
            LoadScriptFlag_ExternalArrayBuffer);
    }
    else
    {
        isString = Js::VarIs<Js::JavascriptString>(scriptVal);
        if (!isString)
        {
            return JsErrorInvalidArgument;
        }
    }

    JsErrorCode error = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        if (isString)
        {
            Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(scriptVal);
            script = (const byte*)jsString->GetSz();

            // JavascriptString is 2 bytes (WCHAR/char16)
            cb = jsString->GetLength() * sizeof(WCHAR);
        }

        if (!Js::VarIs<Js::JavascriptString>(sourceUrl))
        {
            return JsErrorInvalidArgument;
        }

        url = Js::VarTo<Js::JavascriptString>(sourceUrl)->GetSz();

        return JsNoError;

    });

    if (error != JsNoError)
    {
        return error;
    }

    return RunScriptCore(scriptVal, script, cb, scriptFlag,
        sourceContext, url, parseOnly, parseAttributes, false, result);
}